

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetEnumFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          EnumDescriptor *desc,bool with_package)

{
  EnumDescriptor *this_00;
  GeneratorOptions *options_00;
  string *psVar1;
  string local_138;
  string local_118;
  byte local_f8;
  allocator local_f7;
  byte local_f6;
  byte local_f5;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  GeneratorOptions *pGStack_20;
  bool with_package_local;
  EnumDescriptor *desc_local;
  GeneratorOptions *options_local;
  
  local_21 = (byte)desc & 1;
  psVar1 = __return_storage_ptr__;
  pGStack_20 = options;
  desc_local = (EnumDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  std::operator+(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/");
  this_00 = desc_local;
  local_f5 = 0;
  local_f6 = 0;
  local_f8 = 0;
  if ((local_21 & 1) == 0) {
    std::allocator<char>::allocator();
    local_f8 = 1;
    std::__cxx11::string::string((string *)&local_a8,"",&local_f7);
  }
  else {
    options_00 = (GeneratorOptions *)EnumDescriptor::file((EnumDescriptor *)pGStack_20);
    GetNamespace_abi_cxx11_
              (&local_e8,(_anonymous_namespace_ *)this_00,options_00,(FileDescriptor *)psVar1);
    local_f5 = 1;
    std::operator+(&local_c8,&local_e8,"_");
    local_f6 = 1;
    anon_unknown_0::ToLower(&local_a8,&local_c8);
  }
  std::operator+(&local_68,&local_88,&local_a8);
  psVar1 = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)pGStack_20);
  anon_unknown_0::ToLower(&local_118,psVar1);
  std::operator+(&local_48,&local_68,&local_118);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_138,(GeneratorOptions *)desc_local);
  std::operator+(__return_storage_ptr__,&local_48,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((local_f8 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f7);
  }
  if ((local_f6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((local_f5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumFileName(const GeneratorOptions& options,
                            const EnumDescriptor* desc, bool with_package) {
  return options.output_dir + "/" +
         (with_package ? ToLower(GetNamespace(options, desc->file()) + "_")
                       : "") +
         ToLower(desc->name()) + options.GetFileNameExtension();
}